

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O3

int __thiscall Fl_Input::kf_lines_up(Fl_Input *this,int repeat_num)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = (this->super_Fl_Input_).position_;
  iVar2 = Fl_Input_::line_start(&this->super_Fl_Input_,iVar3);
  if (iVar2 == 0) {
    bVar1 = Fl::option(OPTION_ARROW_FOCUS);
    uVar4 = (uint)!bVar1;
  }
  else {
    if (repeat_num != 0) {
      do {
        iVar3 = Fl_Input_::line_start(&this->super_Fl_Input_,iVar3);
        if (iVar3 == 0) {
          iVar3 = 0;
          break;
        }
        iVar3 = iVar3 + -1;
        repeat_num = repeat_num + -1;
      } while (repeat_num != 0);
    }
    iVar3 = Fl_Input_::line_start(&this->super_Fl_Input_,iVar3);
    Fl_Input_::up_down_position(&this->super_Fl_Input_,iVar3,Fl::e_state & 0x10000);
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

int Fl_Input::kf_lines_up(int repeat_num) {
  int i = position();
  if (!line_start(i)) {
    //UNNEEDED if (input_type()==FL_MULTILINE_INPUT && !Fl::option(Fl::OPTION_ARROW_FOCUS)) return 1;
    return NORMAL_INPUT_MOVE;
  }
  while(repeat_num--) {
    i = line_start(i);
    if (!i) break;
    i--;
  }
  shift_up_down_position(line_start(i));
  return 1;
}